

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_state.cpp
# Opt level: O3

void __thiscall
duckdb::CleanupState::CleanupState(CleanupState *this,transaction_t lowest_active_transaction)

{
  (this->indexed_tables)._M_h._M_buckets = &(this->indexed_tables)._M_h._M_single_bucket;
  (this->indexed_tables)._M_h._M_bucket_count = 1;
  (this->indexed_tables)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->indexed_tables)._M_h._M_element_count = 0;
  (this->indexed_tables)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->indexed_tables)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->indexed_tables)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->lowest_active_transaction = lowest_active_transaction;
  (this->current_table).ptr = (DataTable *)0x0;
  DataChunk::DataChunk(&this->chunk);
  this->count = 0;
  return;
}

Assistant:

CleanupState::CleanupState(transaction_t lowest_active_transaction)
    : lowest_active_transaction(lowest_active_transaction), current_table(nullptr), count(0) {
}